

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void nni_msg_header_append_u32(nni_msg *m,uint32_t val)

{
  size_t sVar1;
  
  sVar1 = m->m_header_len;
  if (sVar1 - 0x3c < 0xffffffffffffffc0) {
    nni_panic("impossible header over-run");
    sVar1 = m->m_header_len;
  }
  *(uint32_t *)((long)m->m_header_buf + sVar1) =
       val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
  m->m_header_len = m->m_header_len + 4;
  return;
}

Assistant:

void
nni_msg_header_append_u32(nni_msg *m, uint32_t val)
{
	uint8_t *dst;
	if ((m->m_header_len + sizeof(val)) >= (sizeof(m->m_header_buf))) {
		nni_panic("impossible header over-run");
	}
	dst = (void *) m->m_header_buf;
	dst += m->m_header_len;
	NNI_PUT32(dst, val);
	m->m_header_len += sizeof(val);
}